

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

void __thiscall DynamicGraph::visualize(DynamicGraph *this,ostream *strm)

{
  pointer puVar1;
  ostream *poVar2;
  size_type sVar3;
  ulong uVar4;
  int i_1;
  DynamicGraph *pDVar5;
  int i;
  long lVar6;
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subgraphs;
  key_type local_58;
  
  std::
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&subgraphs,this->nextComponent,(allocator_type *)&local_58);
  lVar6 = 0;
  for (uVar4 = 0; uVar4 < this->nextComponent; uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<((ostream *)
                             (subgraphs.
                              super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar6),
                             "  subgraph cluster");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)uVar4);
    poVar2 = std::operator<<(poVar2," { label = \"Component ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)uVar4 + 1);
    lVar6 = lVar6 + 0x178;
    std::operator<<(poVar2,"\" ");
  }
  for (uVar4 = 0;
      puVar1 = (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->components).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar4 = uVar4 + 1) {
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)
                        (subgraphs.
                         super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + puVar1[uVar4] * 0x178 + -0x178)
                        ,(int)uVar4);
    std::operator<<(poVar2,"; ");
  }
  lVar6 = 0;
  for (uVar4 = 0; uVar4 < this->nextComponent; uVar4 = uVar4 + 1) {
    std::operator<<((ostream *)
                    (subgraphs.
                     super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar6)," }\n");
    lVar6 = lVar6 + 0x178;
  }
  poVar2 = std::operator<<(strm,"graph G {");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(strm,"  size=\"5,3\"");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(strm,"  ratio=\"fill\"");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(strm,"  edge[style=\"bold\"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(strm,"  node[shape=\"circle\"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar4 = 0; uVar4 < this->nextComponent; uVar4 = uVar4 + 1) {
    std::__cxx11::stringbuf::str();
    std::operator<<(strm,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  pDVar5 = this;
  while (pDVar5 = *(DynamicGraph **)
                   &(pDVar5->super_UndirectedGraph).super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node.super__List_node_base, pDVar5 != this) {
    poVar2 = std::operator<<(strm,"  ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," -- ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_58.m_eproperty =
         &(pDVar5->super_UndirectedGraph).super_type.m_vertices.
          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         (pDVar5->super_UndirectedGraph).super_type.m_edges.
         super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
         ._M_impl._M_node._M_size;
    local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         (unsigned_long)
         (pDVar5->super_UndirectedGraph).super_type.m_vertices.
         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
         ._M_impl.super__Vector_impl_data._M_start;
    sVar3 = std::
            set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::count(&this->virtualEdges,&local_58);
    if (sVar3 != 0) {
      std::operator<<(strm," [style=dotted]");
    }
    poVar2 = std::operator<<(strm,";");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<(strm,"}");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&subgraphs);
  return;
}

Assistant:

void DynamicGraph::visualize(std::ostream &strm) const
{
    // Creating components streams
    std::vector<std::ostringstream> subgraphs(this->nextComponent);
    for(int i = 0; i<this->nextComponent; ++i) {
        subgraphs[i] << "  subgraph cluster" << i << " { label = \"Component " << i+1 << "\" ";
    }
    for(int i = 0; i<this->components.size(); ++i) {
        subgraphs[components[i]-1] << i << "; ";
    }
    for(int i = 0; i<this->nextComponent; ++i) {
        subgraphs[i] << " }\n";
    }

    // Printing graph style
    strm << "graph G {" << std::endl;
    strm << "  size=\"5,3\"" << std::endl;
    strm << "  ratio=\"fill\"" << std::endl;
    strm << "  edge[style=\"bold\"]" << std::endl;
    strm << "  node[shape=\"circle\"]" << std::endl;
    // Print subgraphs by vertices
    for(int i = 0; i<this->nextComponent; ++i) {
        strm  << subgraphs[i].str();
    }
    // Print edges
    EdgeIterator ei, ei_end;
    for (tie(ei, ei_end) = edges(*this); ei != ei_end; ++ei) {
        Vertex u,v;
        Edge e = *ei;
        u = source(e, *this);
        v = target(e, *this);
        strm << "  " << u << " -- " << v;
        if (virtualEdges.count(*ei)) strm << " [style=dotted]";
        strm << ";" << std::endl;
    }

    strm << "}" << std::endl;
}